

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FboCases::IntersectingQuadsTest::render
          (IntersectingQuadsTest *this,Context *ctx,Surface *dst)

{
  uint program;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  int in_R9D;
  Vec3 local_1d8;
  Vec3 local_1c8;
  Framebuffer fbo;
  SingleTex2DShader texShader;
  
  SingleTex2DShader::SingleTex2DShader(&texShader);
  program = (*ctx->_vptr_Context[0x75])(ctx,&texShader);
  createMetaballsTex2D(ctx,1,0x1907,0x40,0x40,in_R9D);
  createQuadsTex2D(ctx,2,0x1907,0x40,0x40,in_R9D);
  uVar2 = this->m_fboWidth;
  uVar3 = this->m_fboHeight;
  Functional::Framebuffer::Framebuffer
            (&fbo,ctx,&(this->super_FboRenderCase).m_config,uVar2,uVar3,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,"u_sampler0");
  (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar1,0);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar2,(ulong)uVar3);
  (*ctx->_vptr_Context[0x2a])(0x3f800000,0,0,0x3f800000,ctx);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  local_1c8.m_data[0] = -1.0;
  local_1c8.m_data[1] = -1.0;
  local_1c8.m_data[2] = -1.0;
  local_1d8.m_data[0] = 1.0;
  local_1d8.m_data[1] = 1.0;
  local_1d8.m_data[2] = 1.0;
  sglr::drawQuad(ctx,program,&local_1c8,&local_1d8);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  local_1c8.m_data[0] = -1.0;
  local_1c8.m_data[1] = -1.0;
  local_1c8.m_data[2] = 1.0;
  local_1d8.m_data[0] = 1.0;
  local_1d8.m_data[1] = 1.0;
  local_1d8.m_data[2] = -1.0;
  sglr::drawQuad(ctx,program,&local_1c8,&local_1d8);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  pp_Var4 = ctx->_vptr_Context;
  if (fbo.m_config.colorbufferType == 0xde1) {
    (*pp_Var4[9])(ctx,0x8d40,0);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_colorbuffer);
    uVar2 = (*ctx->_vptr_Context[2])(ctx);
    uVar3 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar2,(ulong)uVar3);
    local_1c8.m_data[0] = -1.0;
    local_1c8.m_data[1] = -1.0;
    local_1c8.m_data[2] = 0.0;
    local_1d8.m_data[0] = 1.0;
    local_1d8.m_data[1] = 1.0;
    local_1d8.m_data[2] = 0.0;
    sglr::drawQuad(ctx,program,&local_1c8,&local_1d8);
    uVar2 = (*ctx->_vptr_Context[2])(ctx);
    uVar3 = (*ctx->_vptr_Context[3])(ctx);
    pp_Var4 = ctx->_vptr_Context;
  }
  (*pp_Var4[0x80])(ctx,dst,0,0,(ulong)uVar2,(ulong)uVar3);
  Functional::Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&texShader.super_ShaderProgram);
  return;
}

Assistant:

void IntersectingQuadsTest::render (sglr::Context& ctx, Surface& dst)
{
	SingleTex2DShader	texShader;
	deUint32			texShaderID = ctx.createProgram(&texShader);

	deUint32 metaballsTex	= 1;
	deUint32 quadsTex		= 2;

	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	int width	= m_fboWidth;
	int height	= m_fboHeight;
	Framebuffer fbo(ctx, getConfig(), width, height);
	fbo.checkCompleteness();

	// Setup shaders
	texShader.setUnit(ctx, texShaderID, 0);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	ctx.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	ctx.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));

	ctx.disable(GL_DEPTH_TEST);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
	{
		// Read from fbo
		ctx.readPixels(dst, 0, 0, width, height);
	}
}